

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O1

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectAnimationTicksPerSecond(CXMeshFileLoader *this)

{
  bool bVar1;
  u32 uVar2;
  char *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  double __x_00;
  string<char> local_38;
  
  bVar1 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar1) {
    uVar2 = readInt(this);
    bVar1 = checkForOneFollowingSemicolons(this);
    if (bVar1) {
      bVar1 = checkForClosingBrace(this);
      if (bVar1) {
        (**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0x60))((float)uVar2);
        return true;
      }
      this_00 = "No closing brace in AnimationTicksPerSecond in x file";
      __x = extraout_XMM0_Qa_01;
    }
    else {
      this_00 = "No closing semicolon in AnimationTicksPerSecond in x file";
      __x = extraout_XMM0_Qa_00;
    }
  }
  else {
    this_00 = "No opening brace in Animation found in x file";
    __x = extraout_XMM0_Qa;
  }
  os::Printer::log((Printer *)this_00,__x);
  core::string<char>::string(&local_38,this->Line);
  os::Printer::log(__x_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.str._M_dataplus._M_p != &local_38.str.field_2) {
    operator_delete(local_38.str._M_dataplus._M_p,local_38.str.field_2._M_allocated_capacity + 1);
  }
  this->ErrorState = true;
  return false;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectAnimationTicksPerSecond()
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading AnimationTicksPerSecond", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Animation found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	const u32 ticks = readInt();

	if (!checkForOneFollowingSemicolons()) {
		os::Printer::log("No closing semicolon in AnimationTicksPerSecond in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in AnimationTicksPerSecond in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	AnimatedMesh->setAnimationSpeed(static_cast<irr::f32>(ticks));

	return true;
}